

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

Vertex_handle __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_vertex
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this)

{
  vertex_descriptor vVar1;
  Graph_vertex *pGVar2;
  value_type local_28;
  Root_vertex_handle local_24;
  boost_vertex_handle local_20;
  boost_vertex_handle local_1c;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *local_18;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  Vertex_handle address;
  
  local_18 = this;
  vVar1 = boost::
          add_vertex<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,boost::no_property,boost::listS>::config>>
                    (&(this->skeleton).super_type);
  Skeleton_blocker_simple_traits::Vertex_handle::Vertex_handle
            ((Vertex_handle *)((long)&this_local + 4),(boost_vertex_handle)vVar1);
  this->num_vertices_ = this->num_vertices_ + 1;
  local_1c = this_local._4_4_;
  pGVar2 = operator[](this,this_local._4_4_);
  Skeleton_blocker_simple_traits::Graph_vertex::activate(pGVar2);
  local_20 = this_local._4_4_;
  pGVar2 = operator[](this,this_local._4_4_);
  Skeleton_blocker_simple_traits::Root_vertex_handle::Root_vertex_handle(&local_24,this_local._4_4_)
  ;
  Skeleton_blocker_simple_traits::Graph_vertex::set_id(pGVar2,local_24);
  local_28 = 0;
  std::vector<int,_std::allocator<int>_>::push_back(&this->degree_,&local_28);
  if (this->visitor != (Visitor *)0x0) {
    (**(code **)(*(long *)this->visitor + 0x10))(this->visitor,this_local._4_4_);
  }
  return (Vertex_handle)this_local._4_4_;
}

Assistant:

Vertex_handle add_vertex() {
    Vertex_handle address(boost::add_vertex(skeleton));
    num_vertices_++;
    (*this)[address].activate();
    // safe since we now that we are in the root complex and the field 'address' and 'id'
    // are identical for every vertices
    (*this)[address].set_id(Root_vertex_handle(address.vertex));
    degree_.push_back(0);
    if (visitor)
      visitor->on_add_vertex(address);
    return address;
  }